

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O3

RefCntAutoPtr<Diligent::DeviceContextVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::DeviceContextVkImpl>::operator=
          (RefCntAutoPtr<Diligent::DeviceContextVkImpl> *this,DeviceContextVkImpl *pObj)

{
  DeviceContextVkImpl *pDVar1;
  char (*in_RCX) [26];
  RefCountersImpl *pRVar2;
  string msg;
  string local_38;
  
  pDVar1 = this->m_pObject;
  if (pDVar1 != pObj) {
    if (pDVar1 != (DeviceContextVkImpl *)0x0) {
      pRVar2 = (pDVar1->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.
               super_ObjectBase<Diligent::IDeviceContextVk>.
               super_RefCountedObject<Diligent::IDeviceContextVk>.m_pRefCounters;
      if (pRVar2 == (RefCountersImpl *)0x0) {
        FormatString<char[26],char[26]>
                  (&local_38,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
        in_RCX = (char (*) [26])0x229;
        DebugAssertionFailed
                  (local_38._M_dataplus._M_p,"Release",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                   ,0x229);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        pRVar2 = (pDVar1->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                 super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                 super_ObjectBase<Diligent::IDeviceContextVk>.
                 super_RefCountedObject<Diligent::IDeviceContextVk>.m_pRefCounters;
      }
      RefCountersImpl::ReleaseStrongRef<Diligent::RefCountersImpl::ReleaseStrongRef()::_lambda()_1_>
                (pRVar2,(anon_class_1_0_00000001 *)&local_38);
    }
    this->m_pObject = pObj;
    if (pObj != (DeviceContextVkImpl *)0x0) {
      pRVar2 = (pObj->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.
               super_ObjectBase<Diligent::IDeviceContextVk>.
               super_RefCountedObject<Diligent::IDeviceContextVk>.m_pRefCounters;
      if (pRVar2 == (RefCountersImpl *)0x0) {
        FormatString<char[26],char[26]>
                  (&local_38,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
        DebugAssertionFailed
                  (local_38._M_dataplus._M_p,"AddRef",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                   ,0x221);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        pRVar2 = (pObj->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                 super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                 super_ObjectBase<Diligent::IDeviceContextVk>.
                 super_RefCountedObject<Diligent::IDeviceContextVk>.m_pRefCounters;
      }
      RefCountersImpl::AddStrongRef(pRVar2);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }